

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_hash.h
# Opt level: O0

void duckdb_brotli::InitializeH6(HasherCommon *common,H6 *self,BrotliEncoderParams *params)

{
  BrotliEncoderParams *params_local;
  H6 *self_local;
  HasherCommon *common_local;
  
  self->common_ = common;
  self->hash_mul_ = 0x7bd3579bd3000000;
  self->bucket_size_ = 1L << ((byte)(common->params).bucket_bits & 0x3f);
  self->block_bits_ = (common->params).block_bits;
  self->block_size_ = 1L << ((byte)(common->params).block_bits & 0x3f);
  self->block_mask_ = (int)self->block_size_ - 1;
  self->num_last_distances_to_check_ = (common->params).num_last_distances_to_check;
  self->num_ = (uint16_t *)common->extra[0];
  self->buckets_ = (uint32_t *)common->extra[1];
  return;
}

Assistant:

static void FN(Initialize)(
    HasherCommon* common, HashLongestMatch* BROTLI_RESTRICT self,
    const BrotliEncoderParams* params) {
  self->common_ = common;

  BROTLI_UNUSED(params);
  self->hash_mul_ = kHashMul64 << (64 - 5 * 8);
  BROTLI_DCHECK(common->params.bucket_bits == 15);
  self->bucket_size_ = (size_t)1 << common->params.bucket_bits;
  self->block_bits_ = common->params.block_bits;
  self->block_size_ = (size_t)1 << common->params.block_bits;
  self->block_mask_ = (uint32_t)(self->block_size_ - 1);
  self->num_last_distances_to_check_ =
      common->params.num_last_distances_to_check;
  self->num_ = (uint16_t*)common->extra[0];
  self->buckets_ = (uint32_t*)common->extra[1];
}